

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____26::test()::ComponentAddedEventReceiver::
receive(entityx::ComponentAddedEvent<Direction>_const__
          (void *this,ComponentAddedEvent<Direction> *event)

{
  IResultCapture *pIVar1;
  Direction *pDVar2;
  ComponentHandle<Direction,_entityx::EntityManager> p;
  float local_c4;
  AssertionHandler local_c0;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ComponentHandle<Direction,_entityx::EntityManager> local_68;
  undefined **local_58;
  undefined1 local_50;
  undefined1 local_4f;
  Direction *local_48;
  char *local_40;
  undefined8 local_38;
  float *local_30;
  
  local_68.manager_._0_4_ = *(undefined4 *)&(event->component).manager_;
  uStack_74 = *(undefined4 *)((long)&(event->component).manager_ + 4);
  uStack_70 = (undefined4)(event->component).id_.id_;
  uStack_6c = *(undefined4 *)((long)&(event->component).id_.id_ + 4);
  local_78 = (float)*(int *)((long)this + 0x44);
  local_c0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_c0.m_assertionInfo.macroName.m_size = 7;
  local_c0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
  ;
  local_c0.m_assertionInfo.lineInfo.line = 0x168;
  local_c0.m_assertionInfo.capturedExpression.m_start = "p->x == -n";
  local_c0.m_assertionInfo.capturedExpression.m_size = 10;
  local_c0.m_assertionInfo.resultDisposition = Normal;
  local_c0.m_reaction.shouldDebugBreak = false;
  local_c0.m_reaction.shouldThrow = false;
  local_c0.m_completed = false;
  local_68.manager_._4_4_ = uStack_74;
  local_68.id_.id_._0_4_ = uStack_70;
  local_68.id_.id_._4_4_ = uStack_6c;
  pIVar1 = Catch::getResultCapture();
  local_c0.m_resultCapture = pIVar1;
  local_48 = entityx::ComponentHandle<Direction,_entityx::EntityManager>::operator->(&local_68);
  local_c4 = -local_78;
  local_30 = &local_c4;
  local_4f = local_c4 == local_48->x;
  local_50 = 1;
  local_58 = &PTR_streamReconstructedExpression_0020ddb0;
  local_40 = "==";
  local_38 = 2;
  (*pIVar1->_vptr_IResultCapture[10])(pIVar1,&local_c0,&local_58,&local_c0.m_reaction);
  Catch::AssertionHandler::complete(&local_c0);
  Catch::AssertionHandler::~AssertionHandler(&local_c0);
  local_c0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_c0.m_assertionInfo.macroName.m_size = 7;
  local_c0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
  ;
  local_c0.m_assertionInfo.lineInfo.line = 0x169;
  local_c0.m_assertionInfo.capturedExpression.m_start = "p->y == -n";
  local_c0.m_assertionInfo.capturedExpression.m_size = 10;
  local_c0.m_assertionInfo.resultDisposition = Normal;
  local_c0.m_reaction.shouldDebugBreak = false;
  local_c0.m_reaction.shouldThrow = false;
  local_c0.m_completed = false;
  pIVar1 = Catch::getResultCapture();
  local_c0.m_resultCapture = pIVar1;
  pDVar2 = entityx::ComponentHandle<Direction,_entityx::EntityManager>::operator->(&local_68);
  local_48 = (Direction *)&pDVar2->y;
  local_c4 = -local_78;
  local_30 = &local_c4;
  local_4f = local_c4 == pDVar2->y;
  local_50 = 1;
  local_58 = &PTR_streamReconstructedExpression_0020ddb0;
  local_40 = "==";
  local_38 = 2;
  (*pIVar1->_vptr_IResultCapture[10])(pIVar1,&local_c0,&local_58,&local_c0.m_reaction);
  Catch::AssertionHandler::complete(&local_c0);
  Catch::AssertionHandler::~AssertionHandler(&local_c0);
  *(int *)((long)this + 0x44) = *(int *)((long)this + 0x44) + 1;
  return;
}

Assistant:

void receive(const ComponentAddedEvent<Direction> &event) {
      auto p = event.component;
      float n = static_cast<float>(direction_events);
      REQUIRE(p->x ==  -n);
      REQUIRE(p->y ==  -n);
      direction_events++;
    }